

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

Iterator *
testing::internal::
CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<std::tuple<unsigned_char,void(*(*)(unsigned_char))(short_const*,unsigned_char*,int,int)>>::Iterator_const,testing::internal::ParamIteratorInterface<std::tuple<unsigned_char,void(*(*)(unsigned_char))(short_const*,unsigned_char*,int,int)>>const>
          (ParamIteratorInterface<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_char_*,_int,_int)>_>
           *base)

{
  bool bVar1;
  ostream *poVar2;
  Iterator *pIVar3;
  long in_RDI;
  int in_stack_0000002c;
  char *in_stack_00000030;
  GTestLogSeverity in_stack_0000003c;
  GTestLog *in_stack_ffffffffffffffc0;
  type_info *in_stack_ffffffffffffffc8;
  type_info *in_stack_ffffffffffffffd0;
  GTestLog *this;
  GTestLog local_c;
  long local_8;
  
  local_8 = in_RDI;
  if (in_RDI == 0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    this = &local_c;
    GTestLog::GTestLog((GTestLog *)base,in_stack_0000003c,in_stack_00000030,in_stack_0000002c);
    poVar2 = GTestLog::GetStream(this);
    std::operator<<(poVar2,"Condition typeid(*base) == typeid(Derived) failed. ");
    GTestLog::~GTestLog(in_stack_ffffffffffffffc0);
  }
  if (local_8 == 0) {
    pIVar3 = (Iterator *)0x0;
  }
  else {
    pIVar3 = (Iterator *)
             __dynamic_cast(local_8,&ParamIteratorInterface<std::tuple<unsigned_char,void(*(*)(unsigned_char))(short_const*,unsigned_char*,int,int)>>
                                     ::typeinfo,
                            &ValuesInIteratorRangeGenerator<std::tuple<unsigned_char,void(*(*)(unsigned_char))(short_const*,unsigned_char*,int,int)>>
                             ::Iterator::typeinfo,0);
  }
  return pIVar3;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}